

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O2

void __thiscall QPainterPathStroker::QPainterPathStroker(QPainterPathStroker *this,QPen *pen)

{
  PenCapStyle style;
  PenJoinStyle style_00;
  PenStyle PVar1;
  QPainterPathStrokerPrivate *this_00;
  long in_FS_OFFSET;
  qreal qVar2;
  QArrayDataPointer<double> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QPainterPathStrokerPrivate *)operator_new(0xd0);
  QPainterPathStrokerPrivate::QPainterPathStrokerPrivate(this_00);
  (this->d_ptr).d = this_00;
  qVar2 = QPen::widthF(pen);
  setWidth(this,qVar2);
  style = QPen::capStyle(pen);
  setCapStyle(this,style);
  style_00 = QPen::joinStyle(pen);
  setJoinStyle(this,style_00);
  qVar2 = QPen::miterLimit(pen);
  (((this->d_ptr).d)->stroker).m_miterLimit = qVar2;
  qVar2 = QPen::dashOffset(pen);
  ((this->d_ptr).d)->dashOffset = qVar2;
  PVar1 = QPen::style(pen);
  if (PVar1 == CustomDashLine) {
    QPen::dashPattern((QList<double> *)&QStack_38,pen);
    setDashPattern(this,(QList<double> *)&QStack_38);
    QArrayDataPointer<double>::~QArrayDataPointer(&QStack_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else {
    PVar1 = QPen::style(pen);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      setDashPattern(this,PVar1);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

QPainterPathStroker::QPainterPathStroker(const QPen &pen)
    : d_ptr(new QPainterPathStrokerPrivate)
{
    setWidth(pen.widthF());
    setCapStyle(pen.capStyle());
    setJoinStyle(pen.joinStyle());
    setMiterLimit(pen.miterLimit());
    setDashOffset(pen.dashOffset());

    if (pen.style() == Qt::CustomDashLine)
        setDashPattern(pen.dashPattern());
    else
        setDashPattern(pen.style());
}